

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::tab::qf1(tab *this,float_t u,vec3 *wi)

{
  uint uVar1;
  float_t fVar2;
  float fVar3;
  float fVar4;
  float local_28;
  
  fVar4 = 0.0;
  if (0.0 <= u) {
    fVar4 = u;
  }
  local_28 = 1.0;
  fVar3 = 1.0;
  if (fVar4 <= 1.0) {
    fVar3 = fVar4;
  }
  if (fVar3 < 1.0) {
    local_28 = 0.0;
    for (uVar1 = 0; (0.0001 < ABS(fVar3) && (uVar1 < 0x1e)); uVar1 = uVar1 + 1) {
      local_28 = local_28 +
                 (float)(int)((uint)(0.0 < fVar3) - (uint)(fVar3 < 0.0)) /
                 (float)(2 << ((byte)uVar1 & 0x1f));
      fVar2 = cdf1(this,local_28,wi);
      fVar3 = u - fVar2;
    }
  }
  return local_28;
}

Assistant:

static T clamp(const T &x, const T &a, const T &b) {return min(b, max(a, x));}